

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O2

LispPTR N_OP_addbase(LispPTR base,LispPTR offset)

{
  uint uVar1;
  LispPTR *pLVar2;
  
  if ((offset & 0xfff0000) == 0xf0000) {
    uVar1 = offset | 0xffff0000;
  }
  else {
    if ((offset & 0xfff0000) != 0xe0000) {
      if ((*(ushort *)((ulong)(offset >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        pLVar2 = NativeAligned4FromLAddr(offset);
        return (base & 0xfffffff) + *pLVar2;
      }
      MachineState.tosvalue = offset;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    uVar1 = offset & 0xffff;
  }
  return uVar1 + (base & 0xfffffff);
}

Assistant:

LispPTR N_OP_addbase(LispPTR base, LispPTR offset) {
  base = POINTERMASK & base;
  switch ((SEGMASK & offset)) {
    case S_POSITIVE: return (base + (offset & 0x0000FFFF));
    case S_NEGATIVE: return (base + (offset | 0xFFFF0000));
    default:
      switch ((GetTypeNumber(offset))) {
        case TYPE_FIXP:
          /* overflow or underflow isn't check */
          return (base + *(int *)NativeAligned4FromLAddr(offset));
        default: /* floatp also */ ERROR_EXIT(offset);
      } /* end switch */
  }     /* end switch */
}